

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  _Alloc_hider _Var1;
  bool bVar2;
  TargetType TVar3;
  _Base_ptr *config;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_c8;
  string local_98;
  size_type local_78;
  pointer local_70;
  string local_68;
  string local_48;
  
  bVar2 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_98,(GeneratorExpressionContent *)context);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"TARGET_SONAME_FILE is not allowed for DLL target platforms.","")
    ;
    reportError((cmGeneratorExpressionContext *)target,&local_98,&local_c8);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar3 == SHARED_LIBRARY) {
      config = &(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      cmGeneratorTarget::GetDirectory
                (&local_48,(cmGeneratorTarget *)this,(string *)config,RuntimeBinaryArtifact);
      _Var1._M_p = local_48._M_dataplus._M_p;
      local_c8._M_string_length = (size_type)&local_c8.field_2;
      local_c8._M_dataplus._M_p = &DAT_00000001;
      local_c8.field_2._M_local_buf[0] = '/';
      cmGeneratorTarget::GetSOName(&local_68,(cmGeneratorTarget *)this,(string *)config);
      local_98._M_dataplus._M_p = (pointer)local_48._M_string_length;
      local_98._M_string_length = (size_type)_Var1._M_p;
      local_98.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
      local_98.field_2._8_8_ = local_c8._M_string_length;
      local_78 = local_68._M_string_length;
      local_70 = local_68._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_98;
      cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_98,(GeneratorExpressionContent *)context);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"TARGET_SONAME_FILE is allowed only for SHARED libraries.","");
    reportError((cmGeneratorExpressionContext *)target,&local_98,&local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }
    std::string result = cmStrCat(target->GetDirectory(context->Config), '/',
                                  target->GetSOName(context->Config));
    return result;
  }